

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O2

bool __thiscall lzham::symbol_codec::encode_arith_init(symbol_codec *this)

{
  bool bVar1;
  output_symbol sym;
  output_symbol local_8;
  
  local_8.m_bits = 0;
  local_8.m_num_bits = -3;
  local_8.m_arith_prob0 = 0;
  bVar1 = vector<lzham::symbol_codec::output_symbol>::try_push_back(&this->m_output_syms,&local_8);
  return bVar1;
}

Assistant:

bool symbol_codec::encode_arith_init()
   {
      LZHAM_ASSERT(m_mode == cEncoding);

      output_symbol sym;
      sym.m_bits = 0;
      sym.m_num_bits = output_symbol::cArithInit;
      sym.m_arith_prob0 = 0;
      if (!m_output_syms.try_push_back(sym))
         return false;

      return true;
   }